

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

int map_land_mass_2(dw_map *map,uint8_t x,uint8_t y,uint8_t lm_index)

{
  byte *pbVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  byte bVar5;
  uint8_t x_00;
  ulong uVar6;
  undefined7 in_register_00000031;
  uint8_t *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar10 = (uint)CONCAT71(in_register_00000031,x);
  uVar6 = CONCAT71(in_register_00000031,x) & 0xffffffff;
  while( true ) {
    bVar5 = (byte)uVar6;
    if ((0x77 < uVar10 - 1) || (map->tiles[uVar10 - 1][y] - 3 < 3)) break;
    uVar6 = (ulong)(byte)(bVar5 - 1);
    uVar10 = (uint)(byte)(bVar5 - 1);
  }
  uVar4 = 0x77;
  uVar3 = uVar6 & 0xff;
  uVar10 = 0;
  if ((bVar5 < 0x78) && (uVar10 = 0, 2 < map->tiles[uVar3][y] - 3)) {
    puVar7 = map->walkable[uVar3] + y;
    uVar10 = 0;
    do {
      uVar4 = uVar10;
      *puVar7 = lm_index;
      if ((byte)(0x78 - bVar5) - 1 == uVar4) {
        uVar10 = (uint)(byte)(0x78 - bVar5);
        break;
      }
      pbVar1 = puVar7 + -0x37c8;
      puVar7 = puVar7 + 0x78;
      uVar10 = uVar4 + 1;
    } while (2 < *pbVar1 - 3);
    uVar4 = uVar4 + (uint)uVar3;
  }
  if ((uint)uVar3 <= uVar4) {
    uVar9 = y - 1;
    uVar8 = y + 1;
    do {
      x_00 = (uint8_t)uVar6;
      uVar6 = uVar6 & 0xff;
      if (((uVar9 < 0x78) && (2 < map->tiles[uVar6][uVar9] - 3)) &&
         (map->walkable[uVar6][uVar9] == '\0')) {
        iVar2 = map_land_mass_2(map,x_00,(uint8_t)uVar9,lm_index);
        uVar10 = uVar10 + iVar2;
      }
      if (((y < 0x77) && (2 < map->tiles[uVar6][uVar8] - 3)) &&
         (map->walkable[uVar6][uVar8] == '\0')) {
        iVar2 = map_land_mass_2(map,x_00,(uint8_t)uVar8,lm_index);
        uVar10 = uVar10 + iVar2;
      }
      uVar6 = (ulong)(byte)(x_00 + 1);
    } while ((byte)(x_00 + 1) <= uVar4);
  }
  return uVar10;
}

Assistant:

static int map_land_mass_2(dw_map *map, uint8_t x, uint8_t y,
        uint8_t lm_index)
{
    int size = 0;
    int left = 0;
    int right = 119;

    /* Move all the way to the left */
    while(!map_ob(x-1) && tile_is_walkable(map->tiles[x-1][y]))
        x--;
    left = x;

    while(!map_ob(x) && tile_is_walkable(map->tiles[x][y])) {
        map->walkable[x][y] = lm_index;
        right = x++;
        size++;
    }
    /* go back to the left side and look up & down */
    for (x = left; x <= right; x++) {
        if (!map_ob(y-1) && tile_is_walkable(map->tiles[x][y-1]) &&
                !map->walkable[x][y-1])
            size += map_land_mass_2(map, x, y-1, lm_index);
        if (!map_ob(y+1) && tile_is_walkable(map->tiles[x][y+1]) &&
                !map->walkable[x][y+1])
            size += map_land_mass_2(map, x, y+1, lm_index);
    }
    return size;
}